

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O3

String * __thiscall
glcts::LayoutBindingBaseCase::buildArrayAccess_abi_cxx11_
          (String *__return_storage_ptr__,LayoutBindingBaseCase *this,int uniform,int idx)

{
  long lVar1;
  ostream *poVar2;
  StringStream s;
  long *local_1e8;
  long local_1e0;
  long local_1d8 [2];
  long *local_1c8;
  long local_1c0;
  long local_1b8 [2];
  undefined1 local_1a8 [112];
  undefined **local_138;
  undefined8 local_60;
  undefined2 local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  std::ios_base::ios_base((ios_base *)&local_138);
  local_138 = (undefined **)glUniformMatrix3x2fv;
  local_60 = 0;
  local_58 = 0;
  local_50 = 0;
  uStack_48 = 0;
  local_40 = 0;
  uStack_38 = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  local_1a8._0_8_ = &PTR__StringStream_020fda68;
  local_138 = &PTR__StringStream_020fda90;
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
            (&local_1e8,this,(ulong)(uint)uniform);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(char *)local_1e8,local_1e0);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1e])
            (&local_1c8,this,(ulong)(uint)idx);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_1c8,local_1c0);
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8,local_1d8[0] + 1);
  }
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&local_1c8,this,0);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
            (&local_1e8,this,&local_1c8);
  lVar1 = local_1e0;
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8,local_1d8[0] + 1);
  }
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  if (lVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".",1);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
              (&local_1e8,this,(ulong)(uint)uniform);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(char *)local_1e8,local_1e0);
    if (local_1e8 != local_1d8) {
      operator_delete(local_1e8,local_1d8[0] + 1);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)&local_138);
  return __return_storage_ptr__;
}

Assistant:

virtual String buildArrayAccess(int uniform, int idx)
	{
		StringStream s;
		s << getDefaultUniformName(uniform) << buildArray(idx);
		if (!buildBlockName(getDefaultUniformName()).empty())
		{
			s << "." << getDefaultUniformName(uniform);
		}
		return s.str();
	}